

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O2

uint8_t * apx_attributeParser_parse_initializer
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,dtl_dv_t **dv)

{
  byte bVar1;
  dtl_av_t *self_00;
  _Bool _Var2;
  uint32_t uVar3;
  apx_attributeParseState_t *paVar4;
  byte *pBegin;
  dtl_av_t *pdVar5;
  ushort **ppuVar6;
  dtl_sv_t *pdVar7;
  byte *pbVar8;
  uint8_t *puVar9;
  byte *next;
  long lVar10;
  long lStack_50;
  
  if ((end == (uint8_t *)0x0 || (begin == (uint8_t *)0x0 || self == (apx_attributeParser_t *)0x0))
     || (dv == (dtl_dv_t **)0x0 || end < begin)) {
    return (uint8_t *)0x0;
  }
  apx_attributeParser_reset(self);
  paVar4 = apx_attributeParseState_new();
  self->state = paVar4;
  pBegin = begin;
  if (paVar4 == (apx_attributeParseState_t *)0x0) {
    self->last_error = 2;
    self->error_next = begin;
  }
LAB_00123003:
  if (end <= pBegin) goto LAB_0012324a;
  pBegin = bstr_lstrip(pBegin,end);
  bVar1 = *pBegin;
  next = pBegin;
  if (bVar1 != 0) {
    if (bVar1 == 0x7b) {
      pdVar5 = dtl_av_new();
      paVar4 = self->state;
      paVar4->initializer_list = pdVar5;
      adt_stack_push(&self->stack,paVar4);
      paVar4 = apx_attributeParseState_new();
      if (paVar4 == (apx_attributeParseState_t *)0x0) goto LAB_00123299;
      paVar4->parent = self->state;
      self->state = paVar4;
      goto LAB_0012323a;
    }
    ppuVar6 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar6 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
      if ((ulong)bVar1 == 0x22) {
        pdVar7 = dtl_sv_new();
        self->state->sv = pdVar7;
        if (end <= pBegin) {
          __assert_fail("begin < end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                        ,0x322,
                        "const uint8_t *apx_attributeParser_parse_string_literal(const uint8_t *, const uint8_t *, dtl_sv_t *)"
                       );
        }
        pbVar8 = bstr_match_pair(pBegin,end,'\"','\"','\\');
        if (pBegin < pbVar8) {
          if (end <= pbVar8) {
            __assert_fail("next < end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,0x326,
                          "const uint8_t *apx_attributeParser_parse_string_literal(const uint8_t *, const uint8_t *, dtl_sv_t *)"
                         );
          }
          dtl_sv_set_bstr(pdVar7,pBegin + 1,pbVar8);
          pbVar8 = pbVar8 + 1;
        }
        if ((pBegin < pbVar8) && (next = pbVar8, end < pbVar8)) {
          __assert_fail("result <= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                        ,0x2fb,
                        "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
      }
      else if (bVar1 == 0x2d) {
        next = pBegin + 1;
        if (next < end) {
          pdVar7 = dtl_sv_new();
          self->state->sv = pdVar7;
          pbVar8 = apx_attributeParser_parse_integer_literal(next,end,true,pdVar7);
          if ((next < pbVar8) && (next = pbVar8, end < pbVar8)) {
            __assert_fail("result <= end",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                          ,0x2eb,
                          "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                         );
          }
          goto LAB_00123158;
        }
        goto LAB_00123299;
      }
    }
    else {
      pdVar7 = dtl_sv_new();
      self->state->sv = pdVar7;
      pbVar8 = apx_attributeParser_parse_integer_literal(pBegin,end,false,pdVar7);
      if ((pBegin < pbVar8) && (next = pbVar8, end < pbVar8)) {
        __assert_fail("result <= end",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                      ,0x2dd,
                      "const uint8_t *apx_attributeParser_parse_scalar(apx_attributeParser_t *, const uint8_t *, const uint8_t *)"
                     );
      }
    }
  }
LAB_00123158:
  if (pBegin < next) {
    pBegin = next;
  }
  while( true ) {
    if (self->state->parent == (apx_attributeParseState_tag *)0x0) goto LAB_0012324a;
    pBegin = bstr_lstrip(pBegin,end);
    bVar1 = *pBegin;
    paVar4 = self->state;
    pdVar5 = (dtl_av_t *)paVar4->sv;
    if (((pdVar5 != (dtl_av_t *)0x0) || (paVar4->initializer_list != (dtl_av_t *)0x0)) &&
       (paVar4->parent != (apx_attributeParseState_tag *)0x0)) {
      self_00 = paVar4->parent->initializer_list;
      if (self_00 == (dtl_av_t *)0x0) {
        __assert_fail("self->state->parent->initializer_list != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                      ,700,"_Bool apx_attributeParser_push_value_to_parent(apx_attributeParser_t *)"
                     );
      }
      lVar10 = 8;
      if (pdVar5 == (dtl_av_t *)0x0) {
        pdVar5 = paVar4->initializer_list;
        lVar10 = 0x10;
        if (pdVar5 == (dtl_av_t *)0x0) goto LAB_00123299;
      }
      dtl_av_push(self_00,(dtl_dv_t *)pdVar5,false);
      *(undefined8 *)((long)&self->state->parent + lVar10) = 0;
      paVar4 = self->state;
    }
    _Var2 = dtl_av_is_empty(paVar4->parent->initializer_list);
    if ((!_Var2) && (bVar1 == 0x2c)) break;
    if ((bVar1 != 0x7d) || (uVar3 = adt_stack_size(&self->stack), uVar3 == 0)) goto LAB_00123299;
    pBegin = pBegin + 1;
    apx_attributeParseState_delete(self->state);
    paVar4 = (apx_attributeParseState_t *)adt_stack_top(&self->stack);
    self->state = paVar4;
    adt_stack_pop(&self->stack);
    uVar3 = adt_stack_size(&self->stack);
    if (uVar3 == 0) goto LAB_0012324a;
  }
LAB_0012323a:
  pBegin = pBegin + 1;
  goto LAB_00123003;
LAB_0012324a:
  puVar9 = bstr_lstrip(pBegin,end);
  if (begin < puVar9) {
    if (end < puVar9) {
      __assert_fail("next <= end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                    ,0x150,
                    "const uint8_t *apx_attributeParser_parse_initializer(apx_attributeParser_t *, const uint8_t *, const uint8_t *, dtl_dv_t **)"
                   );
    }
    pdVar5 = self->state->initializer_list;
    if (pdVar5 == (dtl_av_t *)0x0) {
      pdVar5 = (dtl_av_t *)self->state->sv;
      if (pdVar5 == (dtl_av_t *)0x0) goto LAB_00123294;
      lStack_50 = 8;
    }
    else {
      lStack_50 = 0x10;
    }
    *dv = (dtl_dv_t *)pdVar5;
    *(undefined8 *)((long)&self->state->parent + lStack_50) = 0;
  }
LAB_00123294:
  if (puVar9 == (uint8_t *)0x0) {
LAB_00123299:
    self->last_error = 3;
    self->error_next = begin;
    puVar9 = (uint8_t *)0x0;
  }
  apx_attributeParseState_delete(self->state);
  self->state = (apx_attributeParseState_t *)0x0;
  return puVar9;
}

Assistant:

uint8_t const* apx_attributeParser_parse_initializer(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, dtl_dv_t** dv)
{
   if ((self != NULL) && (begin != NULL) && (end != NULL) && (begin <= end) && (dv != NULL))
   {
      uint8_t const* next;
      apx_attributeParser_reset(self);
      self->state = apx_attributeParseState_new();
      if (self->state == NULL)
      {
         apx_attributeParser_set_error(self, APX_MEM_ERROR, begin);
      }
      next = apx_attributeParser_parse_initializer_list(self, begin, end);
      if (next > begin)
      {
         assert(next <= end);
         if (self->state->initializer_list != NULL)
         {
            *dv = (dtl_dv_t*)self->state->initializer_list;
            self->state->initializer_list = NULL;
         }
         else if (self->state->sv != NULL)
         {
            *dv = (dtl_dv_t*)self->state->sv;
            self->state->sv = NULL;
         }
      }
      if (next == NULL)
      {
         apx_attributeParser_set_error(self, APX_PARSE_ERROR, begin);
      }
      apx_attributeParseState_delete(self->state);
      self->state = NULL;
      return next;
   }
   return NULL;
}